

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
serial::Serial::readlines
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Serial *this,size_t size,string *eol)

{
  uint8_t *buffer;
  long lVar1;
  Serial *this_00;
  string *__rhs;
  undefined8 uVar2;
  __type _Var3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t sStack_90;
  Serial *local_88;
  long local_80;
  string *local_78;
  ScopedReadLock local_70;
  ScopedReadLock lock;
  size_type local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_70.pimpl_ = this->pimpl_;
  sStack_90 = 0x108413;
  local_88 = this;
  SerialImpl::readLock(local_70.pimpl_);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = __return_storage_ptr__;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  local_78 = eol;
  local_80 = -eol->_M_string_length;
  lVar1 = -(size + 0xf & 0xfffffffffffffff0);
  local_48 = (long)&local_88 + lVar1;
  local_38 = 0;
  do {
    this_00 = local_88;
    if (size <= uVar7) goto LAB_00108577;
    buffer = (uint8_t *)(local_48 + uVar7);
    *(undefined8 *)((long)&sStack_90 + lVar1) = 1;
    sVar4 = *(size_t *)((long)&sStack_90 + lVar1);
    *(undefined8 *)((long)&sStack_90 + lVar1) = 0x10846e;
    sVar4 = read_(this_00,buffer,sVar4);
    uVar7 = uVar7 + sVar4;
    if (sVar4 == 0) {
      if (local_38 == uVar7) goto LAB_00108577;
      lVar6 = local_38 + local_48;
      lock.pimpl_ = (SerialImpl *)&stack0xffffffffffffffa8;
      lVar5 = uVar7 + local_48;
      *(undefined8 *)((long)&sStack_90 + lVar1) = 0x108561;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lock,lVar6,lVar5);
      uVar2 = local_40;
      *(undefined8 *)((long)&sStack_90 + lVar1) = 0x10856e;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)uVar2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock);
      goto LAB_0010856e;
    }
    lVar6 = local_48 + uVar7;
    lVar5 = local_80 + lVar6;
    lock.pimpl_ = (SerialImpl *)&stack0xffffffffffffffa8;
    *(undefined8 *)((long)&sStack_90 + lVar1) = 0x1084a4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lock,lVar5,lVar6);
    __rhs = local_78;
    *(undefined8 *)((long)&sStack_90 + lVar1) = 0x1084b0;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &lock,__rhs);
    *(undefined8 *)((long)&sStack_90 + lVar1) = 0x1084bb;
    std::__cxx11::string::~string((string *)&lock);
    if (_Var3) {
      lVar5 = local_38 + local_48;
      lock.pimpl_ = (SerialImpl *)&stack0xffffffffffffffa8;
      *(undefined8 *)((long)&sStack_90 + lVar1) = 0x1084db;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lock,lVar5,lVar6);
      uVar2 = local_40;
      *(undefined8 *)((long)&sStack_90 + lVar1) = 0x1084e7;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)uVar2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock);
      *(undefined8 *)((long)&sStack_90 + lVar1) = 0x1084f2;
      std::__cxx11::string::~string((string *)&lock);
      local_38 = uVar7;
    }
  } while (uVar7 != size);
  if (local_38 != size) {
    lVar6 = local_38 + local_48;
    lock.pimpl_ = (SerialImpl *)&stack0xffffffffffffffa8;
    lVar5 = size + local_48;
    *(undefined8 *)((long)&sStack_90 + lVar1) = 0x10852b;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lock,lVar6,lVar5);
    uVar2 = local_40;
    *(undefined8 *)((long)&sStack_90 + lVar1) = 0x108538;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)uVar2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock);
LAB_0010856e:
    *(undefined8 *)((long)&sStack_90 + lVar1) = 0x108577;
    std::__cxx11::string::~string((string *)&lock);
  }
LAB_00108577:
  *(undefined8 *)((long)&sStack_90 + lVar1) = 0x108580;
  ScopedReadLock::~ScopedReadLock(&local_70);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_40;
}

Assistant:

vector<string>
Serial::readlines (size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  std::vector<std::string> lines;
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
    (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  size_t start_of_line = 0;
  while (read_so_far < size) {
    size_t bytes_read = this->read_ (buffer_+read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      if (start_of_line != read_so_far) {
        lines.push_back (
          string (reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      // EOL found
      lines.push_back(
        string(reinterpret_cast<const char*> (buffer_ + start_of_line),
          read_so_far - start_of_line));
      start_of_line = read_so_far;
    }
    if (read_so_far == size) {
      if (start_of_line != read_so_far) {
        lines.push_back(
          string(reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Reached the maximum read length
    }
  }
  return lines;
}